

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_get.c
# Opt level: O0

int test_get_number(unsigned_long number)

{
  unsigned_long number_local;
  
  test_get_request = (nhr_request)nhr_request_create();
  switch(number) {
  case 1:
    nhr_request_set_url(test_get_request,"http","httpbin.org","/get",0x50);
    break;
  case 2:
    nhr_request_set_url(test_get_request,"http","httpbin.org","/deflate",0x50);
    break;
  case 3:
    nhr_request_set_url(test_get_request,"http","httpbin.org","/gzip",0x50);
    break;
  case 4:
    nhr_request_set_url(test_get_request,"http","httpbin.org","/status/418",0x50);
    break;
  case 5:
    nhr_request_set_url(test_get_request,"http","httpbin.org","/range/1024",0x50);
  }
  nhr_request_set_method(test_get_request,1);
  nhr_request_set_timeout(test_get_request,10);
  nhr_request_set_user_object(test_get_request,number);
  nhr_request_add_header_field(test_get_request,"Cache-control","no-cache");
  nhr_request_add_header_field(test_get_request,"Accept-Charset","utf-8");
  nhr_request_add_header_field(test_get_request,"Accept","application/json");
  nhr_request_add_header_field(test_get_request,"Connection","close");
  nhr_request_add_header_field(test_get_request,"User-Agent","CMake tests");
  switch(number) {
  case 1:
    nhr_request_add_parameter(test_get_request,test_get_param_name1,test_get_param_value1);
    break;
  case 2:
    nhr_request_add_header_field(test_get_request,"Accept-Encoding","deflate");
    break;
  case 3:
    nhr_request_add_header_field(test_get_request,"Accept-Encoding","gzip");
    break;
  case 5:
    nhr_request_set_timeout(test_get_request,0x14);
    nhr_request_add_parameter(test_get_request,"duration","1");
    nhr_request_add_parameter(test_get_request,"chunk_size","375");
  default:
  }
  nhr_request_set_on_recvd_response(test_get_request,test_get_on_response);
  nhr_request_set_on_error(test_get_request,test_get_on_error);
  test_get_working = nhr_request_send(test_get_request);
  if (test_get_working == '\0') {
    test_get_error = 4;
  }
  else {
    test_get_error = 0;
  }
  while (test_get_working != '\0') {
    nhr_thread_sleep(0x14);
  }
  nhr_thread_sleep(0x342);
  return test_get_error;
}

Assistant:

static int test_get_number(unsigned long number) {

	test_get_request = nhr_request_create();

	switch (number) {
		case 1: nhr_request_set_url(test_get_request, "http", "httpbin.org", "/get", 80); break;
		case 2: nhr_request_set_url(test_get_request, "http", "httpbin.org", "/deflate", 80); break;
		case 3: nhr_request_set_url(test_get_request, "http", "httpbin.org", "/gzip", 80); break;
		case 4: nhr_request_set_url(test_get_request, "http", "httpbin.org", "/status/418", 80); break;
		case 5: nhr_request_set_url(test_get_request, "http", "httpbin.org", "/range/1024", 80); break;
		default:
			break;
	}


	nhr_request_set_method(test_get_request, nhr_method_GET);
	nhr_request_set_timeout(test_get_request, 10);

	nhr_request_set_user_object(test_get_request, (void*)number);

	nhr_request_add_header_field(test_get_request, "Cache-control", "no-cache");
	nhr_request_add_header_field(test_get_request, "Accept-Charset", "utf-8");
	nhr_request_add_header_field(test_get_request, "Accept", "application/json");
	nhr_request_add_header_field(test_get_request, "Connection", "close");
	nhr_request_add_header_field(test_get_request, "User-Agent", "CMake tests");

	switch (number) {
		case 1:
			nhr_request_add_parameter(test_get_request, test_get_param_name1, test_get_param_value1);
			break;

		case 2:
			nhr_request_add_header_field(test_get_request, "Accept-Encoding", k_nhr_deflate);
			break;

		case 3:
			nhr_request_add_header_field(test_get_request, "Accept-Encoding", k_nhr_gzip);
			break;

		case 5:
			// chunked, total 1024, chunk_size 375, delay 1
			nhr_request_set_timeout(test_get_request, 20); // increase default delay
			nhr_request_add_parameter(test_get_request, "duration", "1");
			nhr_request_add_parameter(test_get_request, "chunk_size", "375");
		default:
			break;
	}

	nhr_request_set_on_recvd_response(test_get_request, &test_get_on_response);
	nhr_request_set_on_error(test_get_request, &test_get_on_error);
	test_get_working = nhr_request_send(test_get_request);

	if (test_get_working) test_get_error = 0;
	else test_get_error = 4;

	while (test_get_working) {
		nhr_thread_sleep(20);
	}

	nhr_thread_sleep(834); // just delay between requests

	return test_get_error;
}